

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void UnlatchCVars(void)

{
  uint32 uVar1;
  bool bVar2;
  undefined1 auStack_20 [4];
  DWORD oldflags;
  FLatchedValue var;
  
  while (bVar2 = TArray<FLatchedValue,_FLatchedValue>::Pop
                           (&LatchedValues,(FLatchedValue *)auStack_20), bVar2) {
    uVar1 = _auStack_20->Flags;
    _auStack_20->Flags = _auStack_20->Flags & 0xffffffeb;
    FBaseCVar::SetGenericRep(_auStack_20,(UCVarValue)var.Variable,var.Value.Int);
    if ((var.Value.Int == 3) && (var.Variable != (FBaseCVar *)0x0)) {
      operator_delete__(var.Variable);
    }
    _auStack_20->Flags = uVar1;
  }
  return;
}

Assistant:

void UnlatchCVars (void)
{
	FLatchedValue var;

	while (LatchedValues.Pop (var))
	{
		DWORD oldflags = var.Variable->Flags;
		var.Variable->Flags &= ~(CVAR_LATCH | CVAR_SERVERINFO);
		var.Variable->SetGenericRep (var.Value, var.Type);
		if (var.Type == CVAR_String)
			delete[] var.Value.String;
		var.Variable->Flags = oldflags;
	}
}